

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecayedException.h
# Opt level: O0

void __thiscall
libsgp4::DecayedException::DecayedException
          (DecayedException *this,DateTime *dt,Vector *pos,Vector *vel)

{
  Vector *vel_local;
  Vector *pos_local;
  DateTime *dt_local;
  DecayedException *this_local;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,"Satellite decayed");
  *(undefined ***)this = &PTR__DecayedException_00117d58;
  (this->_dt).m_encoded = dt->m_encoded;
  Vector::Vector(&this->_pos,pos);
  Vector::Vector(&this->_vel,vel);
  return;
}

Assistant:

DecayedException(const DateTime& dt, const Vector& pos, const Vector& vel)
        : runtime_error("Satellite decayed")
        , _dt(dt)
        , _pos(pos)
        , _vel(vel)
    {
    }